

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O3

void opengv::relative_pose::modules::fivept_kneip::groebnerRow31_100000000_f
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  
  lVar34 = (long)targetRow;
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x1bd8];
  auVar33._8_8_ = 0x8000000000000000;
  auVar33._0_8_ = 0x8000000000000000;
  auVar35 = vxorpd_avx512vl(auVar36,auVar33);
  auVar37._0_8_ =
       auVar35._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2791];
  auVar37._8_8_ = auVar35._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x1bd8] = 0.0;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2815];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x1c5c];
  auVar35 = vfmadd213sd_fma(auVar38,auVar37,auVar35);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x1c5c] = auVar35._0_8_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2857];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar34 + 0x1c9e];
  auVar35 = vfmadd213sd_fma(auVar39,auVar37,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x1c9e] = auVar35._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2899];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar34 + 0x1ce0];
  auVar35 = vfmadd213sd_fma(auVar40,auVar37,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x1ce0] = auVar35._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x28db];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar34 + 0x1d22];
  auVar35 = vfmadd213sd_fma(auVar41,auVar37,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x1d22] = auVar35._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x291d];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar34 + 0x1d64];
  auVar35 = vfmadd213sd_fma(auVar42,auVar37,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x1d64] = auVar35._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x295f];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar34 + 0x1da6];
  auVar35 = vfmadd213sd_fma(auVar43,auVar37,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x1da6] = auVar35._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x29a1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar34 + 0x1de8];
  auVar35 = vfmadd213sd_fma(auVar44,auVar37,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x1de8] = auVar35._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x29e3];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar34 + 0x1e2a];
  auVar35 = vfmadd213sd_fma(auVar45,auVar37,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x1e2a] = auVar35._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2bf3];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar34 + 0x203a];
  auVar35 = vfmadd213sd_fma(auVar46,auVar37,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x203a] = auVar35._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2c35];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar34 + 0x207c];
  auVar35 = vfmadd213sd_fma(auVar47,auVar37,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x207c] = auVar35._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2cb9];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2100];
  auVar35 = vfmadd213sd_fma(auVar48,auVar37,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2100] = auVar35._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2cfb];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2142];
  auVar35 = vfmadd213sd_fma(auVar49,auVar37,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2142] = auVar35._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d7f];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x21c6];
  auVar35 = vfmadd213sd_fma(auVar50,auVar37,auVar12);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x21c6] = auVar35._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2dc1];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2208];
  auVar35 = vfmadd213sd_fma(auVar51,auVar37,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2208] = auVar35._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e03];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x224a];
  auVar35 = vfmadd213sd_fma(auVar52,auVar37,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x224a] = auVar35._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e45];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x228c];
  auVar35 = vfmadd213sd_fma(auVar53,auVar37,auVar15);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x228c] = auVar35._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e87];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x22ce];
  auVar35 = vfmadd213sd_fma(auVar54,auVar37,auVar16);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x22ce] = auVar35._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2ec9];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2310];
  auVar35 = vfmadd213sd_fma(auVar55,auVar37,auVar17);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2310] = auVar35._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f0b];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2352];
  auVar35 = vfmadd213sd_fma(auVar56,auVar37,auVar18);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2352] = auVar35._0_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f4d];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2394];
  auVar35 = vfmadd213sd_fma(auVar57,auVar37,auVar19);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2394] = auVar35._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f8f];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x23d6];
  auVar35 = vfmadd213sd_fma(auVar58,auVar37,auVar20);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x23d6] = auVar35._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2fd1];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2418];
  auVar35 = vfmadd213sd_fma(auVar59,auVar37,auVar21);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2418] = auVar35._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3013];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x245a];
  auVar35 = vfmadd213sd_fma(auVar60,auVar37,auVar22);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x245a] = auVar35._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3055];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2de4];
  auVar35 = vfmadd213sd_fma(auVar61,auVar37,auVar23);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2de4] = auVar35._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3097];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2e26];
  auVar35 = vfmadd213sd_fma(auVar62,auVar37,auVar24);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2e26] = auVar35._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30d9];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2e68];
  auVar35 = vfmadd213sd_fma(auVar63,auVar37,auVar25);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2e68] = auVar35._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x311b];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2eaa];
  auVar35 = vfmadd213sd_fma(auVar64,auVar37,auVar26);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2eaa] = auVar35._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x315d];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2eec];
  auVar35 = vfmadd213sd_fma(auVar65,auVar37,auVar27);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2eec] = auVar35._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x319f];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2f2e];
  auVar35 = vfmadd213sd_fma(auVar66,auVar37,auVar28);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2f2e] = auVar35._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31e1];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2f70];
  auVar35 = vfmadd213sd_fma(auVar67,auVar37,auVar29);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2f70] = auVar35._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3223];
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2fb2];
  auVar35 = vfmadd213sd_fma(auVar68,auVar37,auVar30);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2fb2] = auVar35._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3265];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x2ff4];
  auVar35 = vfmadd213sd_fma(auVar69,auVar37,auVar31);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x2ff4] = auVar35._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x32a7];
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar34 + 0x3246];
  auVar35 = vfmadd213sd_fma(auVar70,auVar37,auVar32);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar34 + 0x3246] = auVar35._0_8_;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::groebnerRow31_100000000_f( Eigen::Matrix<double,66,197> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,108) / groebnerMatrix(31,153);
  groebnerMatrix(targetRow,108) = 0.0;
  groebnerMatrix(targetRow,110) -= factor * groebnerMatrix(31,155);
  groebnerMatrix(targetRow,111) -= factor * groebnerMatrix(31,156);
  groebnerMatrix(targetRow,112) -= factor * groebnerMatrix(31,157);
  groebnerMatrix(targetRow,113) -= factor * groebnerMatrix(31,158);
  groebnerMatrix(targetRow,114) -= factor * groebnerMatrix(31,159);
  groebnerMatrix(targetRow,115) -= factor * groebnerMatrix(31,160);
  groebnerMatrix(targetRow,116) -= factor * groebnerMatrix(31,161);
  groebnerMatrix(targetRow,117) -= factor * groebnerMatrix(31,162);
  groebnerMatrix(targetRow,125) -= factor * groebnerMatrix(31,170);
  groebnerMatrix(targetRow,126) -= factor * groebnerMatrix(31,171);
  groebnerMatrix(targetRow,128) -= factor * groebnerMatrix(31,173);
  groebnerMatrix(targetRow,129) -= factor * groebnerMatrix(31,174);
  groebnerMatrix(targetRow,131) -= factor * groebnerMatrix(31,176);
  groebnerMatrix(targetRow,132) -= factor * groebnerMatrix(31,177);
  groebnerMatrix(targetRow,133) -= factor * groebnerMatrix(31,178);
  groebnerMatrix(targetRow,134) -= factor * groebnerMatrix(31,179);
  groebnerMatrix(targetRow,135) -= factor * groebnerMatrix(31,180);
  groebnerMatrix(targetRow,136) -= factor * groebnerMatrix(31,181);
  groebnerMatrix(targetRow,137) -= factor * groebnerMatrix(31,182);
  groebnerMatrix(targetRow,138) -= factor * groebnerMatrix(31,183);
  groebnerMatrix(targetRow,139) -= factor * groebnerMatrix(31,184);
  groebnerMatrix(targetRow,140) -= factor * groebnerMatrix(31,185);
  groebnerMatrix(targetRow,141) -= factor * groebnerMatrix(31,186);
  groebnerMatrix(targetRow,178) -= factor * groebnerMatrix(31,187);
  groebnerMatrix(targetRow,179) -= factor * groebnerMatrix(31,188);
  groebnerMatrix(targetRow,180) -= factor * groebnerMatrix(31,189);
  groebnerMatrix(targetRow,181) -= factor * groebnerMatrix(31,190);
  groebnerMatrix(targetRow,182) -= factor * groebnerMatrix(31,191);
  groebnerMatrix(targetRow,183) -= factor * groebnerMatrix(31,192);
  groebnerMatrix(targetRow,184) -= factor * groebnerMatrix(31,193);
  groebnerMatrix(targetRow,185) -= factor * groebnerMatrix(31,194);
  groebnerMatrix(targetRow,186) -= factor * groebnerMatrix(31,195);
  groebnerMatrix(targetRow,195) -= factor * groebnerMatrix(31,196);
}